

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleinterp.cpp
# Opt level: O1

void __thiscall BrainFuckInterpreter::~BrainFuckInterpreter(BrainFuckInterpreter *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->tape_ != (uint8_t *)0x0) {
    operator_delete__(this->tape_);
  }
  pcVar1 = (this->p_).program._M_dataplus._M_p;
  paVar2 = &(this->p_).program.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~BrainFuckInterpreter() {
        delete []tape_;
    }